

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::MemObjectAllocator::MemObjectAllocator
          (MemObjectAllocator *this,TestLog *log,RenderContext *renderContext,
          MemObjectType objectTypes,MemObjectConfig *config,int seed)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  value_type_conflict4 *__val;
  pointer puVar8;
  int iVar9;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_seed = seed;
  this->m_objectCount = 0;
  this->m_bytesRequired = 0;
  this->m_objectTypes = objectTypes;
  this->m_result = RESULT_LAST;
  iVar1 = config->maxBufferSize;
  iVar9 = config->minTextureSize;
  iVar4 = config->maxTextureSize;
  (this->m_config).minBufferSize = config->minBufferSize;
  (this->m_config).maxBufferSize = iVar1;
  (this->m_config).minTextureSize = iVar9;
  (this->m_config).maxTextureSize = iVar4;
  bVar5 = config->write;
  bVar6 = config->use;
  uVar7 = config->field_0x13;
  (this->m_config).useDummyData = config->useDummyData;
  (this->m_config).write = bVar5;
  (this->m_config).use = bVar6;
  (this->m_config).field_0x13 = uVar7;
  this->m_glError = 0;
  (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BufferRenderer::BufferRenderer(&this->m_bufferRenderer,log,renderContext);
  TextureRenderer::TextureRenderer(&this->m_textureRenderer,log,renderContext);
  if ((this->m_config).useDummyData == true) {
    iVar1 = (this->m_config).maxBufferSize;
    iVar9 = (this->m_config).maxTextureSize;
    iVar9 = iVar9 * iVar9 * 4;
    if (iVar9 < iVar1) {
      iVar9 = iVar1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(long)iVar9,&local_49);
    puVar2 = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else if ((this->m_config).write == true) {
    puVar8 = (pointer)operator_new(0x80);
    puVar8[0x70] = '\0';
    puVar8[0x71] = '\0';
    puVar8[0x72] = '\0';
    puVar8[0x73] = '\0';
    puVar8[0x74] = '\0';
    puVar8[0x75] = '\0';
    puVar8[0x76] = '\0';
    puVar8[0x77] = '\0';
    puVar8[0x78] = '\0';
    puVar8[0x79] = '\0';
    puVar8[0x7a] = '\0';
    puVar8[0x7b] = '\0';
    puVar8[0x7c] = '\0';
    puVar8[0x7d] = '\0';
    puVar8[0x7e] = '\0';
    puVar8[0x7f] = '\0';
    puVar8[0x60] = '\0';
    puVar8[0x61] = '\0';
    puVar8[0x62] = '\0';
    puVar8[99] = '\0';
    puVar8[100] = '\0';
    puVar8[0x65] = '\0';
    puVar8[0x66] = '\0';
    puVar8[0x67] = '\0';
    puVar8[0x68] = '\0';
    puVar8[0x69] = '\0';
    puVar8[0x6a] = '\0';
    puVar8[0x6b] = '\0';
    puVar8[0x6c] = '\0';
    puVar8[0x6d] = '\0';
    puVar8[0x6e] = '\0';
    puVar8[0x6f] = '\0';
    puVar8[0x50] = '\0';
    puVar8[0x51] = '\0';
    puVar8[0x52] = '\0';
    puVar8[0x53] = '\0';
    puVar8[0x54] = '\0';
    puVar8[0x55] = '\0';
    puVar8[0x56] = '\0';
    puVar8[0x57] = '\0';
    puVar8[0x58] = '\0';
    puVar8[0x59] = '\0';
    puVar8[0x5a] = '\0';
    puVar8[0x5b] = '\0';
    puVar8[0x5c] = '\0';
    puVar8[0x5d] = '\0';
    puVar8[0x5e] = '\0';
    puVar8[0x5f] = '\0';
    puVar8[0x40] = '\0';
    puVar8[0x41] = '\0';
    puVar8[0x42] = '\0';
    puVar8[0x43] = '\0';
    puVar8[0x44] = '\0';
    puVar8[0x45] = '\0';
    puVar8[0x46] = '\0';
    puVar8[0x47] = '\0';
    puVar8[0x48] = '\0';
    puVar8[0x49] = '\0';
    puVar8[0x4a] = '\0';
    puVar8[0x4b] = '\0';
    puVar8[0x4c] = '\0';
    puVar8[0x4d] = '\0';
    puVar8[0x4e] = '\0';
    puVar8[0x4f] = '\0';
    puVar8[0x30] = '\0';
    puVar8[0x31] = '\0';
    puVar8[0x32] = '\0';
    puVar8[0x33] = '\0';
    puVar8[0x34] = '\0';
    puVar8[0x35] = '\0';
    puVar8[0x36] = '\0';
    puVar8[0x37] = '\0';
    puVar8[0x38] = '\0';
    puVar8[0x39] = '\0';
    puVar8[0x3a] = '\0';
    puVar8[0x3b] = '\0';
    puVar8[0x3c] = '\0';
    puVar8[0x3d] = '\0';
    puVar8[0x3e] = '\0';
    puVar8[0x3f] = '\0';
    puVar8[0x20] = '\0';
    puVar8[0x21] = '\0';
    puVar8[0x22] = '\0';
    puVar8[0x23] = '\0';
    puVar8[0x24] = '\0';
    puVar8[0x25] = '\0';
    puVar8[0x26] = '\0';
    puVar8[0x27] = '\0';
    puVar8[0x28] = '\0';
    puVar8[0x29] = '\0';
    puVar8[0x2a] = '\0';
    puVar8[0x2b] = '\0';
    puVar8[0x2c] = '\0';
    puVar8[0x2d] = '\0';
    puVar8[0x2e] = '\0';
    puVar8[0x2f] = '\0';
    puVar8[0x10] = '\0';
    puVar8[0x11] = '\0';
    puVar8[0x12] = '\0';
    puVar8[0x13] = '\0';
    puVar8[0x14] = '\0';
    puVar8[0x15] = '\0';
    puVar8[0x16] = '\0';
    puVar8[0x17] = '\0';
    puVar8[0x18] = '\0';
    puVar8[0x19] = '\0';
    puVar8[0x1a] = '\0';
    puVar8[0x1b] = '\0';
    puVar8[0x1c] = '\0';
    puVar8[0x1d] = '\0';
    puVar8[0x1e] = '\0';
    puVar8[0x1f] = '\0';
    puVar8[0] = '\0';
    puVar8[1] = '\0';
    puVar8[2] = '\0';
    puVar8[3] = '\0';
    puVar8[4] = '\0';
    puVar8[5] = '\0';
    puVar8[6] = '\0';
    puVar8[7] = '\0';
    puVar8[8] = '\0';
    puVar8[9] = '\0';
    puVar8[10] = '\0';
    puVar8[0xb] = '\0';
    puVar8[0xc] = '\0';
    puVar8[0xd] = '\0';
    puVar8[0xe] = '\0';
    puVar8[0xf] = '\0';
    puVar2 = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar8;
    (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8 + 0x80;
    (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar8 + 0x80;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
      return;
    }
  }
  return;
}

Assistant:

MemObjectAllocator::MemObjectAllocator (tcu::TestLog& log, glu::RenderContext& renderContext, MemObjectType objectTypes, const MemObjectConfig& config, int seed)
	: m_seed			(seed)
	, m_objectCount		(0)
	, m_bytesRequired	(0)
	, m_objectTypes		(objectTypes)
	, m_result			(RESULT_LAST)
	, m_config			(config)
	, m_glError			(0)
	, m_bufferRenderer	(log, renderContext)
	, m_textureRenderer	(log, renderContext)
{
	DE_UNREF(renderContext);

	if (m_config.useDummyData)
	{
		int dummySize = deMax32(m_config.maxBufferSize, m_config.maxTextureSize*m_config.maxTextureSize*4);
		m_dummyData = vector<deUint8>(dummySize);
	}
	else if (m_config.write)
		m_dummyData = vector<deUint8>(128);
}